

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.tab.hh
# Opt level: O3

shared_ptr<tchecker::var_expression_t> * __thiscall
tchecker::parsing::program::parser_t::value_type::as<std::shared_ptr<tchecker::var_expression_t>>
          (value_type *this)

{
  char *__s1;
  int iVar1;
  
  if (this->yytypeid_ == (type_info *)0x0) {
    __assert_fail("yytypeid_",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O3/src/parsing/program_parser/program.tab.hh"
                  ,0x144,
                  "T &tchecker::parsing::program::parser_t::value_type::as() [T = std::shared_ptr<tchecker::var_expression_t>]"
                 );
  }
  __s1 = *(char **)(this->yytypeid_ + 8);
  if (__s1 == "St10shared_ptrIN8tchecker16var_expression_tEE") {
    return (shared_ptr<tchecker::var_expression_t> *)this;
  }
  if ((*__s1 != '*') &&
     (iVar1 = strcmp(__s1,"St10shared_ptrIN8tchecker16var_expression_tEE"), iVar1 == 0)) {
    return (shared_ptr<tchecker::var_expression_t> *)this;
  }
  __assert_fail("*yytypeid_ == typeid (T)",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O3/src/parsing/program_parser/program.tab.hh"
                ,0x145,
                "T &tchecker::parsing::program::parser_t::value_type::as() [T = std::shared_ptr<tchecker::var_expression_t>]"
               );
}

Assistant:

T&
    as () YY_NOEXCEPT
    {
      PPYY_ASSERT (yytypeid_);
      PPYY_ASSERT (*yytypeid_ == typeid (T));
      PPYY_ASSERT (sizeof (T) <= size);
      return *yyas_<T> ();
    }